

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* fmt::v9::
  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&>
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  basic_string_view<char> *arg;
  undefined1 local_108 [40];
  undefined1 *local_e0;
  char *local_88;
  size_t sStack_80;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  char *local_68;
  size_t sStack_60;
  char **local_58;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48 [3];
  undefined1 *local_30;
  basic_string_view<char> local_28;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_18;
  basic_string_view<char> local_10;
  
  local_e0 = local_108;
  local_30 = &local_69;
  local_28 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1e1e2e);
  local_68 = local_28.data_;
  sStack_60 = local_28.size_;
  local_58 = &local_68;
  local_6a = 1;
  local_6b = 1;
  local_6c = 1;
  local_6d = 1;
  local_88 = local_28.data_;
  sStack_80 = local_28.size_;
  local_18 = local_48;
  local_10.data_ = local_88;
  local_10.size_ = sStack_80;
  local_48[0] = (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)basic_string_view<char>::data(&local_10);
  basic_string_view<char>::size(&local_10);
  return local_48[0];
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}